

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::WriteModelItem(MemoryWriter *wrt,QuadraticObjective *obj,ItemNamer *vnam)

{
  size_t sVar1;
  BasicWriter<char> *this;
  char *pcVar2;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  
  pcVar2 = "maximize ";
  if ((obj->super_NLObjective).super_LinearObjective.sense_ == MIN) {
    pcVar2 = "minimize ";
  }
  value.size_ = 9;
  value.data_ = pcVar2;
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  pcVar2 = (obj->super_NLObjective).super_LinearObjective.name_._M_dataplus._M_p;
  sVar1 = strlen(pcVar2);
  value_00.size_ = sVar1;
  value_00.data_ = pcVar2;
  this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  value_01.size_ = 2;
  value_01.data_ = ": ";
  fmt::BasicWriter<char>::operator<<(this,value_01);
  WriteModelItem(wrt,&(obj->super_NLObjective).super_LinearObjective.lt_,vnam);
  if ((obj->qt_).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    if (*(size_ty *)
         ((long)&(obj->super_NLObjective).super_LinearObjective.lt_.coefs_.
                 super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long> + 0x10) != 0) {
      value_02.size_ = 3;
      value_02.data_ = " + ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_02);
    }
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
    WriteModelItem(wrt,&obj->qt_,vnam);
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
    return;
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadraticObjective& obj,
                    ItemNamer& vnam) {
  wrt << (obj.obj_sense() ? "maximize " : "minimize ");
  assert(obj.name() && *obj.name());
  wrt << obj.name() << ": ";
  WriteModelItem(wrt, obj.GetLinTerms(), vnam);
  if (obj.GetQPTerms().size()) {
    if (obj.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, obj.GetQPTerms(), vnam);
    wrt << ')';
  }
}